

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlabel.cpp
# Opt level: O0

QMenu * __thiscall QLabelPrivate::createStandardContextMenu(QLabelPrivate *this,QPoint *pos)

{
  long lVar1;
  QLabelPrivate *in_RSI;
  QLabelPrivate *in_RDI;
  long in_FS_OFFSET;
  QPoint p;
  QWidget *in_stack_00000140;
  QPointF *in_stack_00000148;
  QWidgetTextControl *in_stack_00000150;
  QPoint *in_stack_ffffffffffffffa8;
  QPointF *in_stack_ffffffffffffffb0;
  QMenu *local_28;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDI->control == (QWidgetTextControl *)0x0) {
    local_28 = (QMenu *)0x0;
  }
  else {
    layoutPoint(in_RSI,(QPoint *)in_RDI);
    QPointF::QPointF(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    q_func(in_RDI);
    local_28 = QWidgetTextControl::createStandardContextMenu
                         (in_stack_00000150,in_stack_00000148,in_stack_00000140);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_28;
  }
  __stack_chk_fail();
}

Assistant:

QMenu *QLabelPrivate::createStandardContextMenu(const QPoint &pos)
{
    if (!control)
        return nullptr;

    const QPoint p = layoutPoint(pos);
    return control->createStandardContextMenu(p, q_func());
}